

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> *field)

{
  size_t *psVar1;
  TableModuleField *pTVar2;
  ModuleField *pMVar3;
  ModuleFieldList *pMVar4;
  Table *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pTVar2 = (field->_M_t).
           super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
           .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl;
  if (*(size_type *)((long)&(pTVar2->table).name + 8) != 0) {
    local_48 = (Table *)(((Location *)
                         ((long)&(pTVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
                                 super_ModuleField + 0x18))->filename)._M_len;
    uStack_40 = *(undefined4 *)
                 ((long)&(pTVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
                         super_ModuleField + 0x20);
    uStack_3c = *(undefined4 *)
                 ((long)&(pTVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
                         super_ModuleField + 0x24);
    local_38 = (((anon_union_16_2_ecfd7102_for_Location_1 *)
                ((long)&(pTVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField
                + 0x28))->field_0).line;
    uStack_34 = *(undefined4 *)
                 ((long)&(pTVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
                         super_ModuleField + 0x2c);
    uStack_30 = *(undefined4 *)
                 ((long)&(pTVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
                         super_ModuleField + 0x30);
    uStack_2c = *(undefined4 *)
                 ((long)&(pTVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
                         super_ModuleField + 0x34);
    local_28 = (undefined4)
               ((ulong)((long)(this->tables).
                              super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->tables).
                             super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->table_bindings,0,&pTVar2->table);
  }
  local_48 = &pTVar2->table;
  std::vector<wabt::Table*,std::allocator<wabt::Table*>>::emplace_back<wabt::Table*>
            ((vector<wabt::Table*,std::allocator<wabt::Table*>> *)&this->tables,&local_48);
  pTVar2 = (field->_M_t).
           super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
           .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>.
  super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl = (TableModuleField *)0x0;
  if ((*(ModuleField **)
        ((long)&(pTVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField + 0x10)
       == (ModuleField *)0x0) &&
     (((intrusive_list_base<wabt::ModuleField> *)
      ((long)&(pTVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField + 8))->
      next_ == (ModuleField *)0x0)) {
    pMVar3 = (this->fields).last_;
    if (pMVar3 == (ModuleField *)0x0) {
      pMVar4 = &this->fields;
    }
    else {
      *(ModuleField **)
       ((long)&(pTVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField + 0x10)
           = pMVar3;
      pMVar4 = (ModuleFieldList *)&pMVar3->super_intrusive_list_base<wabt::ModuleField>;
    }
    pMVar4->first_ = (ModuleField *)pTVar2;
    (this->fields).last_ = (ModuleField *)pTVar2;
    psVar1 = &(this->fields).size_;
    *psVar1 = *psVar1 + 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                ,0x1bd,
                "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
               );
}

Assistant:

void Module::AppendField(std::unique_ptr<TableModuleField> field) {
  Table& table = field->table;
  if (!table.name.empty()) {
    table_bindings.emplace(table.name, Binding(field->loc, tables.size()));
  }
  tables.push_back(&table);
  fields.push_back(std::move(field));
}